

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cpp
# Opt level: O3

bool __thiscall
ArgsManager::ReadConfigStream
          (ArgsManager *this,istream *stream,string *filepath,string *error,bool ignore_invalid_keys
          )

{
  list<SectionInfo,_std::allocator<SectionInfo>_> *__position;
  pointer pcVar1;
  string key;
  string *__n;
  size_t sVar2;
  pointer ppVar3;
  char cVar4;
  bool bVar5;
  int iVar6;
  istream *piVar7;
  void *pvVar8;
  KeyInfo *pKVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar10;
  size_type sVar11;
  size_type sVar12;
  optional<unsigned_int> oVar13;
  mapped_type *this_00;
  mapped_type *this_01;
  undefined8 uVar14;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar15;
  char *pcVar16;
  uint uVar17;
  char *__data;
  undefined1 *puVar18;
  _Alloc_hider _Var19;
  undefined7 in_register_00000081;
  KeyInfo *pKVar20;
  size_type __size;
  ulong uVar21;
  KeyInfo *pKVar22;
  _Alloc_hider _Var23;
  pointer fmt;
  _Alloc_hider this_02;
  long in_FS_OFFSET;
  string_view source_file;
  string_view logging_function;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  options;
  string_view value;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock2;
  optional<UniValue> value_1;
  string str;
  string name;
  string prefix;
  Level in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe2c;
  char *in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe40;
  uint in_stack_fffffffffffffe44;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_188;
  int local_164;
  basic_string_view<char,_std::char_traits<char>_> local_160;
  unique_lock<std::recursive_mutex> local_150;
  undefined1 local_140 [16];
  undefined1 local_130 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_120;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_110;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100;
  bool local_e8;
  long *local_e0 [2];
  long local_d0 [2];
  KeyInfo local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  long local_38;
  
  uVar14 = CONCAT71(in_register_00000081,ignore_invalid_keys);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_150._M_owns = false;
  local_150._M_device = (mutex_type *)this;
  std::unique_lock<std::recursive_mutex>::lock(&local_150);
  local_188.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_188.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_188.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __position = &this->m_config_sections;
  local_c0.name._M_dataplus._M_p = (pointer)&local_c0.name.field_2;
  local_c0.name._M_string_length = 0;
  local_c0.name.field_2._M_local_buf[0] = '\0';
  local_58._M_allocated_capacity = (size_type)&local_48;
  local_58._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_48._M_local_buf[0] = '\0';
  local_164 = 1;
  while( true ) {
    cVar4 = std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + (char)stream);
    piVar7 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       (stream,(string *)&local_c0,cVar4);
    _Var19._M_p = local_c0.name._M_dataplus._M_p;
    pcVar16 = *(char **)(*(long *)piVar7 + -0x18);
    uVar17 = *(uint *)(piVar7 + 0x20 + (long)pcVar16);
    if ((uVar17 & 5) != 0) break;
    bVar5 = true;
    if ((KeyInfo *)local_c0.name._M_string_length != (KeyInfo *)0x0) {
      pvVar8 = memchr(local_c0.name._M_dataplus._M_p,0x23,local_c0.name._M_string_length);
      if ((long)pvVar8 - (long)_Var19._M_p != 0xffffffffffffffff && pvVar8 != (void *)0x0) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140,
                   &local_c0.name,0,(long)pvVar8 - (long)_Var19._M_p);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (&local_c0.name,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140);
        if ((KeyInfo *)local_140._0_8_ != (KeyInfo *)local_130) {
          operator_delete((void *)local_140._0_8_,(ulong)(local_130._0_8_ + 1));
        }
        bVar5 = false;
      }
    }
    if (GetConfigOptions(std::istream&,std::__cxx11::string_const&,std::__cxx11::string&,std::vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>&,std::__cxx11::list<SectionInfo,std::allocator<SectionInfo>>&)
        ::pattern_abi_cxx11_ == '\0') {
      ReadConfigStream();
    }
    sVar12 = local_c0.name._M_string_length;
    _Var19._M_p = local_c0.name._M_dataplus._M_p;
    sVar2 = DAT_006c7438;
    pcVar16 = GetConfigOptions(std::istream&,std::__cxx11::string_const&,std::__cxx11::string&,std::vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>&,std::__cxx11::list<SectionInfo,std::allocator<SectionInfo>>&)
              ::pattern_abi_cxx11_;
    local_78._M_dataplus._M_p = (pointer)local_c0.name._M_string_length;
    local_78._M_string_length = (size_type)local_c0.name._M_dataplus._M_p;
    if ((KeyInfo *)local_c0.name._M_string_length == (KeyInfo *)0x0) {
LAB_003ed454:
      uVar21 = 0;
      puVar18 = (undefined1 *)0x0;
    }
    else {
      if (DAT_006c7438 != 0) {
        this_02._M_p = (pointer)0x0;
        do {
          pvVar8 = memchr(pcVar16,(int)_Var19._M_p[(long)this_02._M_p],sVar2);
          if (pvVar8 == (void *)0x0) {
            if ((KeyInfo *)this_02._M_p != (KeyInfo *)0xffffffffffffffff) {
              sVar11 = std::basic_string_view<char,_std::char_traits<char>_>::find_last_not_of
                                 ((basic_string_view<char,_std::char_traits<char>_> *)&local_78,
                                  pcVar16,0xffffffffffffffff,sVar2);
              _Var23._M_p = local_78._M_dataplus._M_p;
              if (this_02._M_p <= local_78._M_dataplus._M_p) {
                pKVar22 = (KeyInfo *)(sVar11 + 1);
                goto LAB_003ed337;
              }
              if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_003ee178;
              std::__throw_out_of_range_fmt
                        ("%s: __pos (which is %zu) > __size (which is %zu)",
                         "basic_string_view::substr",this_02._M_p,local_78._M_dataplus._M_p);
              goto LAB_003edea2;
            }
            break;
          }
          this_02._M_p = (pointer)((long)&(((KeyInfo *)this_02._M_p)->name)._M_dataplus._M_p + 1);
        } while ((pointer)sVar12 != this_02._M_p);
        goto LAB_003ed454;
      }
      this_02._M_p = (pointer)0x0;
      pKVar22 = (KeyInfo *)local_c0.name._M_string_length;
LAB_003ed337:
      uVar21 = (long)local_78._M_dataplus._M_p - (long)this_02._M_p;
      if ((ulong)((long)pKVar22 - (long)this_02._M_p) <=
          (ulong)((long)local_78._M_dataplus._M_p - (long)this_02._M_p)) {
        uVar21 = (long)pKVar22 - (long)this_02._M_p;
      }
      puVar18 = (undefined1 *)
                ((long)&(((string *)local_78._M_string_length)->_M_dataplus)._M_p +
                (long)&(((KeyInfo *)this_02._M_p)->name)._M_dataplus._M_p);
    }
    local_140._0_8_ = (KeyInfo *)local_130;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_140,puVar18,puVar18 + uVar21);
    this_02._M_p = (pointer)&local_c0;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_02._M_p,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140);
    if ((KeyInfo *)local_140._0_8_ != (KeyInfo *)local_130) {
      operator_delete((void *)local_140._0_8_,(ulong)(local_130._0_8_ + 1));
    }
    pKVar22 = (KeyInfo *)local_c0.name._M_string_length;
    _Var19._M_p = local_c0.name._M_dataplus._M_p;
    if ((KeyInfo *)local_c0.name._M_string_length != (KeyInfo *)0x0) {
      if (*local_c0.name._M_dataplus._M_p != '[') {
        if (*local_c0.name._M_dataplus._M_p != '-') goto LAB_003ed3d8;
        pcVar16 = (char *)&local_c0;
        tinyformat::format<int,std::__cxx11::string>
                  ((string *)local_140,
                   (tinyformat *)
                   "parse error on line %i: %s, options in configuration file must be specified without leading -"
                   ,(char *)&local_164,(int *)pcVar16,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)uVar14);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (error,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_140);
        uVar14 = local_130._0_8_;
        _Var19._M_p = (pointer)local_140._0_8_;
        in_stack_fffffffffffffe44 = uVar17;
        if ((KeyInfo *)local_140._0_8_ != (KeyInfo *)local_130) {
LAB_003edb56:
          operator_delete(_Var19._M_p,(ulong)(uVar14 + 1));
        }
        break;
      }
      if ((local_c0.name._M_dataplus._M_p + -1)[local_c0.name._M_string_length] == ']') {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  (&local_78,&local_c0.name,1,
                   (size_type)&((KeyInfo *)(local_c0.name._M_string_length + -0x48))->field_0x46);
        local_140._0_8_ = local_130;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_140,local_78._M_dataplus._M_p,
                   local_78._M_dataplus._M_p + (long)(string *)local_78._M_string_length);
        local_120._M_allocated_capacity = (size_type)&local_110;
        pcVar1 = (filepath->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)(local_130 + 0x10),pcVar1,pcVar1 + filepath->_M_string_length);
        local_100._M_allocated_capacity._0_4_ = local_164;
        std::__cxx11::list<SectionInfo,_std::allocator<SectionInfo>_>::_M_insert<SectionInfo>
                  (__position,(iterator)__position,(SectionInfo *)local_140);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_120._M_allocated_capacity != &local_110) {
          operator_delete((void *)local_120._M_allocated_capacity,
                          (ulong)(local_110._M_allocated_capacity + 1));
        }
        if ((undefined1 *)local_140._0_8_ != local_130) {
          operator_delete((void *)local_140._0_8_,(ulong)(local_130._0_8_ + 1));
        }
        local_140._0_8_ = local_130;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_140,local_78._M_dataplus._M_p,
                   local_78._M_dataplus._M_p + (long)(string *)local_78._M_string_length);
        uVar14 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2e;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        _M_replace_aux((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_140,local_140._8_8_,0,1,'.');
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_58,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140);
LAB_003ed910:
        if ((KeyInfo *)local_140._0_8_ != (KeyInfo *)local_130) {
          operator_delete((void *)local_140._0_8_,(ulong)(local_130._0_8_ + 1));
        }
      }
      else {
LAB_003ed3d8:
        pKVar9 = (KeyInfo *)
                 memchr(local_c0.name._M_dataplus._M_p,0x3d,local_c0.name._M_string_length);
        sVar2 = DAT_006c7438;
        pcVar16 = GetConfigOptions(std::istream&,std::__cxx11::string_const&,std::__cxx11::string&,std::vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>&,std::__cxx11::list<SectionInfo,std::allocator<SectionInfo>>&)
                  ::pattern_abi_cxx11_;
        if ((pKVar9 == (KeyInfo *)0x0) ||
           (pKVar20 = (KeyInfo *)((long)pKVar9 - (long)_Var19._M_p),
           pKVar20 == (KeyInfo *)0xffffffffffffffff)) {
          pcVar16 = (char *)&local_c0;
          tinyformat::format<int,std::__cxx11::string>
                    ((string *)local_140,(tinyformat *)"parse error on line %i: %s",
                     (char *)&local_164,(int *)pcVar16,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)uVar14);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    (error,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_140);
          in_stack_fffffffffffffe44 = uVar17;
          if ((KeyInfo *)local_140._0_8_ != (KeyInfo *)local_130) {
            operator_delete((void *)local_140._0_8_,(ulong)(local_130._0_8_ + 1));
          }
          if ((KeyInfo *)0x1 < local_c0.name._M_string_length) {
            pcVar16 = (char *)0x2;
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_140,&local_c0.name,0,2);
            iVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_140,"no");
            if ((KeyInfo *)local_140._0_8_ != (KeyInfo *)local_130) {
              operator_delete((void *)local_140._0_8_,(ulong)(local_130._0_8_ + 1));
            }
            if (iVar6 == 0) {
              tinyformat::format<std::__cxx11::string>
                        ((string *)local_140,
                         (tinyformat *)
                         ", if you intended to specify a negated option, use %s=1 instead",
                         (char *)&local_c0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         pcVar16);
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              _M_append(error,(char *)local_140._0_8_,local_140._8_8_);
              uVar14 = local_130._0_8_;
              _Var19._M_p = (pointer)local_140._0_8_;
              if ((KeyInfo *)local_140._0_8_ != (KeyInfo *)local_130) goto LAB_003edb56;
            }
          }
          break;
        }
        if (pKVar20 <= pKVar22) {
          pKVar22 = pKVar20;
        }
        local_160._M_str = _Var19._M_p;
        local_160._M_len = (size_t)pKVar22;
        if (pKVar9 == (KeyInfo *)_Var19._M_p) {
LAB_003ed4be:
          uVar21 = 0;
          puVar18 = (undefined1 *)0x0;
        }
        else {
          if (DAT_006c7438 != 0) {
            this_02._M_p = (pointer)0x0;
            do {
              pvVar8 = memchr(pcVar16,(int)_Var19._M_p[(long)this_02._M_p],sVar2);
              if (pvVar8 == (void *)0x0) {
                if ((KeyInfo *)this_02._M_p != (KeyInfo *)0xffffffffffffffff) {
                  sVar11 = std::basic_string_view<char,_std::char_traits<char>_>::find_last_not_of
                                     (&local_160,pcVar16,0xffffffffffffffff,sVar2);
                  _Var23._M_p = (pointer)local_160._M_len;
                  if (local_160._M_len < this_02._M_p) goto LAB_003eded4;
                  pKVar22 = (KeyInfo *)(sVar11 + 1);
                  goto LAB_003ed4a4;
                }
                break;
              }
              this_02._M_p = (pointer)((long)&(((KeyInfo *)this_02._M_p)->name)._M_dataplus._M_p + 1
                                      );
            } while (pKVar22 != (KeyInfo *)this_02._M_p);
            goto LAB_003ed4be;
          }
          this_02._M_p = (pointer)0x0;
LAB_003ed4a4:
          uVar21 = local_160._M_len - (long)this_02._M_p;
          if ((ulong)((long)pKVar22 - (long)this_02._M_p) <= local_160._M_len - (long)this_02._M_p)
          {
            uVar21 = (long)pKVar22 - (long)this_02._M_p;
          }
          puVar18 = (undefined1 *)
                    ((long)&(((string *)local_160._M_str)->_M_dataplus)._M_p +
                    (long)&(((KeyInfo *)this_02._M_p)->name)._M_dataplus._M_p);
        }
        local_140._0_8_ = local_130;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_140,puVar18,puVar18 + uVar21);
        uVar14 = local_58._8_8_;
        pbVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_140,0,0,(char *)local_58._M_allocated_capacity,local_58._8_8_);
        local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
        pKVar22 = (KeyInfo *)(pbVar10->_M_dataplus)._M_p;
        paVar15 = &pbVar10->field_2;
        if (pKVar22 == (KeyInfo *)paVar15) {
          local_78.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
          local_78.field_2._8_8_ = *(undefined8 *)((long)&pbVar10->field_2 + 8);
        }
        else {
          local_78.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
          local_78._M_dataplus._M_p = (pointer)pKVar22;
        }
        local_78._M_string_length = pbVar10->_M_string_length;
        (pbVar10->_M_dataplus)._M_p = (pointer)paVar15;
        pbVar10->_M_string_length = 0;
        (pbVar10->field_2)._M_local_buf[0] = '\0';
        if ((KeyInfo *)local_140._0_8_ != (KeyInfo *)local_130) {
          operator_delete((void *)local_140._0_8_,(ulong)(local_130._0_8_ + 1));
        }
        sVar2 = DAT_006c7438;
        pcVar16 = GetConfigOptions(std::istream&,std::__cxx11::string_const&,std::__cxx11::string&,std::vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>&,std::__cxx11::list<SectionInfo,std::allocator<SectionInfo>>&)
                  ::pattern_abi_cxx11_;
        _Var19._M_p = (pointer)((long)&(pKVar20->name)._M_dataplus._M_p + 1);
        _Var23._M_p = (pointer)local_c0.name._M_string_length;
        if (local_c0.name._M_string_length <= pKVar20) {
LAB_003edea2:
          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
            std::__throw_out_of_range_fmt
                      ("%s: __pos (which is %zu) > __size (which is %zu)",
                       "basic_string_view::substr",_Var19._M_p,_Var23._M_p);
LAB_003eded4:
            if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
              uVar14 = std::__throw_out_of_range_fmt
                                 ("%s: __pos (which is %zu) > __size (which is %zu)",
                                  "basic_string_view::substr",this_02._M_p,_Var23._M_p);
              if ((KeyInfo *)local_140._0_8_ != (KeyInfo *)local_130) {
                operator_delete((void *)local_140._0_8_,(ulong)(local_130._0_8_ + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_58._M_allocated_capacity != &local_48) {
                operator_delete((void *)local_58._M_allocated_capacity,
                                CONCAT71(local_48._M_allocated_capacity._1_7_,
                                         local_48._M_local_buf[0]) + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_c0.name._M_dataplus._M_p != &local_c0.name.field_2) {
                operator_delete(local_c0.name._M_dataplus._M_p,
                                CONCAT71(local_c0.name.field_2._M_allocated_capacity._1_7_,
                                         local_c0.name.field_2._M_local_buf[0]) + 1);
              }
              std::
              vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::~vector(&local_188);
              std::unique_lock<std::recursive_mutex>::~unique_lock(&local_150);
              if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                _Unwind_Resume(uVar14);
              }
            }
          }
          goto LAB_003ee178;
        }
        this_02._M_p = local_c0.name._M_dataplus._M_p + (long)_Var19._M_p;
        pKVar22 = (KeyInfo *)(local_c0.name._M_string_length - (long)_Var19._M_p);
        local_140._0_8_ = pKVar22;
        local_140._8_8_ = this_02._M_p;
        if (pKVar22 == (KeyInfo *)0x0) {
LAB_003ed652:
          local_160._M_len = 0;
          local_160._M_str = (char *)0x0;
        }
        else {
          if (DAT_006c7438 != 0) {
            _Var19._M_p = (pointer)0x0;
            do {
              pvVar8 = memchr(pcVar16,(int)this_02._M_p[(long)_Var19._M_p],sVar2);
              if (pvVar8 == (void *)0x0) {
                if ((KeyInfo *)_Var19._M_p != (KeyInfo *)0xffffffffffffffff) {
                  sVar11 = std::basic_string_view<char,_std::char_traits<char>_>::find_last_not_of
                                     ((basic_string_view<char,_std::char_traits<char>_> *)local_140,
                                      pcVar16,0xffffffffffffffff,sVar2);
                  _Var23._M_p = (pointer)local_140._0_8_;
                  if ((ulong)local_140._0_8_ < _Var19._M_p) goto LAB_003edea2;
                  pKVar22 = (KeyInfo *)(sVar11 + 1);
                  goto LAB_003ed638;
                }
                break;
              }
              _Var19._M_p = (pointer)((long)&(((KeyInfo *)_Var19._M_p)->name)._M_dataplus._M_p + 1);
            } while (pKVar22 != (KeyInfo *)_Var19._M_p);
            goto LAB_003ed652;
          }
          _Var19._M_p = (pointer)0x0;
LAB_003ed638:
          local_160._M_len = (size_t)(local_140._0_8_ - (long)_Var19._M_p);
          if ((KeyInfo *)((long)pKVar22 - (long)_Var19._M_p) <=
              (KeyInfo *)(local_140._0_8_ - (long)_Var19._M_p)) {
            local_160._M_len = (size_t)((long)pKVar22 - (long)_Var19._M_p);
          }
          local_160._M_str =
               (char *)((long)&(((KeyInfo *)_Var19._M_p)->name)._M_dataplus._M_p + local_140._8_8_);
        }
        if (!bVar5) {
          pcVar16 = (char *)0xb;
          sVar12 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   find(&local_78,"rpcpassword",0,0xb);
          if (sVar12 != 0xffffffffffffffff) {
            tinyformat::format<int>
                      ((string *)local_140,
                       "parse error on line %i, using # in rpcpassword can be ambiguous and should be avoided"
                       ,&local_164);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator=(error,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_140);
            in_stack_fffffffffffffe44 = uVar17;
            if ((KeyInfo *)local_140._0_8_ != (KeyInfo *)local_130) {
              operator_delete((void *)local_140._0_8_,(ulong)(local_130._0_8_ + 1));
            }
            uVar14 = local_78.field_2._M_allocated_capacity;
            _Var19._M_p = local_78._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_78._M_dataplus._M_p != &local_78.field_2) goto LAB_003edb56;
            break;
          }
        }
        std::
        vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
        ::emplace_back<std::__cxx11::string&,std::basic_string_view<char,std::char_traits<char>>&>
                  ((vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                    *)&local_188,&local_78,&local_160);
        pKVar22 = (KeyInfo *)local_78._M_string_length;
        if ((KeyInfo *)local_78._M_string_length != (KeyInfo *)0x0) {
          do {
            __n = (string *)&pKVar22[-1].field_0x47;
            if (pKVar22 == (KeyInfo *)0x0) goto LAB_003ed93d;
            pcVar16 = local_78._M_dataplus._M_p + -1 + (long)pKVar22;
            pKVar22 = (KeyInfo *)__n;
          } while (*pcVar16 != '.');
          if ((ulong)local_58._8_8_ <= __n) {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_140,&local_78,0,(size_type)__n);
            local_120._M_allocated_capacity = (size_type)&local_110;
            pcVar1 = (filepath->_M_dataplus)._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)(local_130 + 0x10),pcVar1,pcVar1 + filepath->_M_string_length);
            local_100._M_allocated_capacity._0_4_ = local_164;
            std::__cxx11::list<SectionInfo,_std::allocator<SectionInfo>_>::_M_insert<SectionInfo>
                      (__position,(iterator)__position,(SectionInfo *)local_140);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_120._M_allocated_capacity != &local_110) {
              operator_delete((void *)local_120._M_allocated_capacity,
                              (ulong)(local_110._M_allocated_capacity + 1));
            }
            goto LAB_003ed910;
          }
        }
      }
LAB_003ed93d:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
    }
    local_164 = local_164 + 1;
    in_stack_fffffffffffffe44 = uVar17;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_allocated_capacity != &local_48) {
    operator_delete((void *)local_58._M_allocated_capacity,
                    CONCAT71(local_48._M_allocated_capacity._1_7_,local_48._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0.name._M_dataplus._M_p != &local_c0.name.field_2) {
    operator_delete(local_c0.name._M_dataplus._M_p,
                    CONCAT71(local_c0.name.field_2._M_allocated_capacity._1_7_,
                             local_c0.name.field_2._M_local_buf[0]) + 1);
  }
  ppVar3 = local_188.
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((uVar17 & 5) == 0) {
LAB_003ede2c:
    bVar5 = false;
  }
  else {
    bVar5 = true;
    if (local_188.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_188.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      fmt = local_188.
            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
      do {
        local_e0[0] = local_d0;
        pcVar1 = (fmt->first)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_e0,pcVar1,pcVar1 + (fmt->first)._M_string_length);
        key._M_dataplus._M_p._4_4_ = in_stack_fffffffffffffe2c;
        key._M_dataplus._M_p._0_4_ = in_stack_fffffffffffffe28;
        key._M_string_length = (size_type)in_stack_fffffffffffffe30;
        key.field_2._M_allocated_capacity = (size_type)error;
        key.field_2._8_4_ = in_stack_fffffffffffffe40;
        key.field_2._12_4_ = in_stack_fffffffffffffe44;
        InterpretKey(&local_c0,key);
        if (local_e0[0] != local_d0) {
          operator_delete(local_e0[0],local_d0[0] + 1);
        }
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_140,'-',&local_c0.name);
        oVar13 = GetArgFlags(this,(string *)local_140);
        if ((KeyInfo *)local_140._0_8_ != (KeyInfo *)local_130) {
          operator_delete((void *)local_140._0_8_,(ulong)(local_130._0_8_ + 1));
        }
        bVar5 = IsConfSupported(&local_c0,error);
        if (!bVar5) {
LAB_003edde2:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c0.section._M_dataplus._M_p != &local_c0.section.field_2) {
            operator_delete(local_c0.section._M_dataplus._M_p,
                            local_c0.section.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c0.name._M_dataplus._M_p != &local_c0.name.field_2) {
            operator_delete(local_c0.name._M_dataplus._M_p,
                            CONCAT71(local_c0.name.field_2._M_allocated_capacity._1_7_,
                                     local_c0.name.field_2._M_local_buf[0]) + 1);
          }
          goto LAB_003ede2c;
        }
        if (((ulong)oVar13.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                    super__Optional_payload_base<unsigned_int> >> 0x20 & 1) == 0) {
          if (!ignore_invalid_keys) {
            tinyformat::format<std::__cxx11::string>
                      ((string *)local_140,(tinyformat *)"Invalid configuration value %s",
                       (char *)fmt,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pcVar16)
            ;
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator=(error,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_140);
            if ((KeyInfo *)local_140._0_8_ != (KeyInfo *)local_130) {
              operator_delete((void *)local_140._0_8_,(ulong)(local_130._0_8_ + 1));
            }
            goto LAB_003edde2;
          }
          in_stack_fffffffffffffe28 = (Level)fmt;
          in_stack_fffffffffffffe2c = (undefined4)((ulong)fmt >> 0x20);
          source_file._M_str =
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/common/config.cpp"
          ;
          source_file._M_len = 0x5a;
          pcVar16 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/common/config.cpp"
          ;
          logging_function._M_str = "ReadConfigStream";
          logging_function._M_len = 0x10;
          LogPrintf_<std::__cxx11::string>
                    (logging_function,source_file,0x6f,
                     I2P|QT|COINDB|MEMPOOLREJ|PROXY|PRUNE|CMPCTBLOCK|ZMQ|BENCH|HTTP|MEMPOOL|TOR|NET,
                     in_stack_fffffffffffffe28,in_stack_fffffffffffffe30,error);
        }
        else {
          pcVar16 = (char *)((ulong)oVar13.super__Optional_base<unsigned_int,_true,_true>._M_payload
                                    .super__Optional_payload_base<unsigned_int> & 0xffffffff);
          InterpretValue((optional<UniValue> *)local_140,&local_c0,&fmt->second,
                         oVar13.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                         super__Optional_payload_base<unsigned_int>._M_payload,error);
          if (local_e8 == false) goto LAB_003edde2;
          this_00 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>_>_>_>
                    ::operator[](&(this->m_settings).ro_config,&local_c0.section);
          this_01 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
                    ::operator[](this_00,&local_c0.name);
          std::vector<UniValue,_std::allocator<UniValue>_>::push_back
                    (this_01,(value_type *)local_140);
          if (local_e8 == true) {
            ::wallet::_GLOBAL__N_1::std::_Optional_payload_base<UniValue>::_M_destroy
                      ((_Optional_payload_base<UniValue> *)local_140);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0.section._M_dataplus._M_p != &local_c0.section.field_2) {
          operator_delete(local_c0.section._M_dataplus._M_p,
                          local_c0.section.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0.name._M_dataplus._M_p != &local_c0.name.field_2) {
          operator_delete(local_c0.name._M_dataplus._M_p,
                          CONCAT71(local_c0.name.field_2._M_allocated_capacity._1_7_,
                                   local_c0.name.field_2._M_local_buf[0]) + 1);
        }
        fmt = fmt + 1;
      } while (fmt != ppVar3);
      bVar5 = true;
    }
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_188);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_150);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar5;
  }
LAB_003ee178:
  __stack_chk_fail();
}

Assistant:

bool ArgsManager::ReadConfigStream(std::istream& stream, const std::string& filepath, std::string& error, bool ignore_invalid_keys)
{
    LOCK(cs_args);
    std::vector<std::pair<std::string, std::string>> options;
    if (!GetConfigOptions(stream, filepath, error, options, m_config_sections)) {
        return false;
    }
    for (const std::pair<std::string, std::string>& option : options) {
        KeyInfo key = InterpretKey(option.first);
        std::optional<unsigned int> flags = GetArgFlags('-' + key.name);
        if (!IsConfSupported(key, error)) return false;
        if (flags) {
            std::optional<common::SettingsValue> value = InterpretValue(key, &option.second, *flags, error);
            if (!value) {
                return false;
            }
            m_settings.ro_config[key.section][key.name].push_back(*value);
        } else {
            if (ignore_invalid_keys) {
                LogPrintf("Ignoring unknown configuration value %s\n", option.first);
            } else {
                error = strprintf("Invalid configuration value %s", option.first);
                return false;
            }
        }
    }
    return true;
}